

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

void DoFilter(VP8EncIterator *it,int level)

{
  long *plVar1;
  uint8_t *__dest;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int in_ESI;
  long in_RDI;
  int hev_thresh;
  uint8_t *v_dst;
  uint8_t *u_dst;
  uint8_t *y_dst;
  int limit;
  int ilevel;
  VP8Encoder *enc;
  
  plVar1 = *(long **)(in_RDI + 0x28);
  iVar4 = GetILevel(*(int *)(*plVar1 + 0x24),in_ESI);
  iVar5 = in_ESI * 2 + iVar4;
  __dest = *(uint8_t **)(in_RDI + 0x18);
  puVar6 = (uint8_t *)(*(long *)(in_RDI + 0x18) + 0x10);
  puVar7 = (uint8_t *)(*(long *)(in_RDI + 0x18) + 0x18);
  memcpy(__dest,*(void **)(in_RDI + 0x10),0x200);
  if ((int)plVar1[2] == 1) {
    (*VP8SimpleHFilter16i)(__dest,0x20,iVar5);
    (*VP8SimpleVFilter16i)(__dest,0x20,iVar5);
  }
  else {
    if (in_ESI < 0x28) {
      uVar2 = 0xe < in_ESI;
    }
    else {
      uVar2 = 2;
    }
    iVar3 = (int)uVar2;
    (*VP8HFilter16i)(__dest,0x20,iVar5,iVar4,iVar3);
    (*VP8HFilter8i)(puVar6,puVar7,0x20,iVar5,iVar4,iVar3);
    (*VP8VFilter16i)(__dest,0x20,iVar5,iVar4,iVar3);
    (*VP8VFilter8i)(puVar6,puVar7,0x20,iVar5,iVar4,iVar3);
  }
  return;
}

Assistant:

static void DoFilter(const VP8Decoder* const dec, int mb_x, int mb_y) {
  const VP8ThreadContext* const ctx = &dec->thread_ctx;
  const int cache_id = ctx->id;
  const int y_bps = dec->cache_y_stride;
  const VP8FInfo* const f_info = ctx->f_info + mb_x;
  uint8_t* const y_dst = dec->cache_y + cache_id * 16 * y_bps + mb_x * 16;
  const int ilevel = f_info->f_ilevel;
  const int limit = f_info->f_limit;
  if (limit == 0) {
    return;
  }
  assert(limit >= 3);
  if (dec->filter_type == 1) {   // simple
    if (mb_x > 0) {
      VP8SimpleHFilter16(y_dst, y_bps, limit + 4);
    }
    if (f_info->f_inner) {
      VP8SimpleHFilter16i(y_dst, y_bps, limit);
    }
    if (mb_y > 0) {
      VP8SimpleVFilter16(y_dst, y_bps, limit + 4);
    }
    if (f_info->f_inner) {
      VP8SimpleVFilter16i(y_dst, y_bps, limit);
    }
  } else {    // complex
    const int uv_bps = dec->cache_uv_stride;
    uint8_t* const u_dst = dec->cache_u + cache_id * 8 * uv_bps + mb_x * 8;
    uint8_t* const v_dst = dec->cache_v + cache_id * 8 * uv_bps + mb_x * 8;
    const int hev_thresh = f_info->hev_thresh;
    if (mb_x > 0) {
      VP8HFilter16(y_dst, y_bps, limit + 4, ilevel, hev_thresh);
      VP8HFilter8(u_dst, v_dst, uv_bps, limit + 4, ilevel, hev_thresh);
    }
    if (f_info->f_inner) {
      VP8HFilter16i(y_dst, y_bps, limit, ilevel, hev_thresh);
      VP8HFilter8i(u_dst, v_dst, uv_bps, limit, ilevel, hev_thresh);
    }
    if (mb_y > 0) {
      VP8VFilter16(y_dst, y_bps, limit + 4, ilevel, hev_thresh);
      VP8VFilter8(u_dst, v_dst, uv_bps, limit + 4, ilevel, hev_thresh);
    }
    if (f_info->f_inner) {
      VP8VFilter16i(y_dst, y_bps, limit, ilevel, hev_thresh);
      VP8VFilter8i(u_dst, v_dst, uv_bps, limit, ilevel, hev_thresh);
    }
  }
}